

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

PortConnection * __thiscall
slang::ast::InstanceSymbol::getPortConnection(InstanceSymbol *this,MultiPortSymbol *port)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  PointerMap *pPVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  
  pPVar10 = this->connectionMap;
  if (pPVar10 == (PointerMap *)0x0) {
    resolvePortConnections(this);
    pPVar10 = this->connectionMap;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = port;
  uVar8 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar11 = uVar8 >> ((byte)(pPVar10->table_).
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar8 & 0xff];
  uVar13 = 0;
  do {
    pgVar1 = (pPVar10->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .arrays.groups_ + uVar11;
    bVar7 = pgVar1->m[0xf].n;
    uVar14 = (uchar)uVar2;
    auVar18[0] = -(pgVar1->m[0].n == uVar14);
    uVar15 = (uchar)((uint)uVar2 >> 8);
    auVar18[1] = -(pgVar1->m[1].n == uVar15);
    uVar16 = (uchar)((uint)uVar2 >> 0x10);
    auVar18[2] = -(pgVar1->m[2].n == uVar16);
    bVar17 = (byte)((uint)uVar2 >> 0x18);
    auVar18[3] = -(pgVar1->m[3].n == bVar17);
    auVar18[4] = -(pgVar1->m[4].n == uVar14);
    auVar18[5] = -(pgVar1->m[5].n == uVar15);
    auVar18[6] = -(pgVar1->m[6].n == uVar16);
    auVar18[7] = -(pgVar1->m[7].n == bVar17);
    auVar18[8] = -(pgVar1->m[8].n == uVar14);
    auVar18[9] = -(pgVar1->m[9].n == uVar15);
    auVar18[10] = -(pgVar1->m[10].n == uVar16);
    auVar18[0xb] = -(pgVar1->m[0xb].n == bVar17);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar14);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar15);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar16);
    auVar18[0xf] = -(bVar7 == bVar17);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar9 != 0) {
      ppVar3 = (pPVar10->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               .arrays.elements_;
      do {
        iVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if (*(MultiPortSymbol **)((long)&ppVar3[uVar11 * 0xf].first + (ulong)(uint)(iVar5 << 4)) ==
            port) {
          return *(PortConnection **)
                  ((long)&ppVar3[uVar11 * 0xf].second + (ulong)(uint)(iVar5 << 4));
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bVar7) == 0) {
      return (PortConnection *)0x0;
    }
    uVar4 = (pPVar10->table_).
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            .arrays.groups_size_mask;
    lVar12 = uVar11 + uVar13;
    uVar13 = uVar13 + 1;
    uVar11 = lVar12 + 1U & uVar4;
  } while (uVar13 <= uVar4);
  return (PortConnection *)0x0;
}

Assistant:

const PortConnection* InstanceSymbol::getPortConnection(const MultiPortSymbol& port) const {
    if (!connectionMap)
        resolvePortConnections();

    auto it = connectionMap->find(reinterpret_cast<uintptr_t>(&port));
    if (it == connectionMap->end())
        return nullptr;

    return reinterpret_cast<const PortConnection*>(it->second);
}